

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O2

DistanceType __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::FindObjectDistanceToAll
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,size_t object)

{
  ulong uVar1;
  DissimilarityMatrixType *this_00;
  size_t anotherObject;
  ulong j;
  DistanceType DVar2;
  DistanceType DVar3;
  
  this_00 = this->matrix;
  uVar1 = this_00->size;
  if (object < uVar1) {
    DVar2 = 0.0;
    for (j = 0; j < uVar1; j = j + 1) {
      DVar3 = CDissimilarityMatrix<float>::Distance(this_00,object,j);
      DVar2 = DVar2 + DVar3;
      this_00 = this->matrix;
      uVar1 = this_00->size;
    }
    return DVar2;
  }
  __assert_fail("object < NumberOfObjects()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/al-pacino[P]Clustering/src_nothreads/PartitioningAroundMedoids.h"
                ,0x4c,
                "typename CPartitioningAroundMedois<DMT>::DistanceType CPartitioningAroundMedois<CDissimilarityMatrix<float>>::FindObjectDistanceToAll(size_t) const [DISSIMILARITY_MATRIX_TYPE = CDissimilarityMatrix<float>]"
               );
}

Assistant:

typename CPartitioningAroundMedois<DMT>::DistanceType
CPartitioningAroundMedois<DMT>::FindObjectDistanceToAll( size_t object ) const
{
	assert( object < NumberOfObjects() );

	DistanceType distance = 0;
	for( size_t anotherObject = 0; anotherObject < NumberOfObjects(); anotherObject++ ) {
		distance += matrix.Distance( object, anotherObject );
	}

	return distance;
}